

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::validate_shader_model(CompilerHLSL *this)

{
  Capability CVar1;
  SmallVector<spv::Capability,_8UL> *this_00;
  Capability *pCVar2;
  CompilerError *pCVar3;
  Capability *cap;
  Capability *__end1;
  Capability *__begin1;
  SmallVector<spv::Capability,_8UL> *__range1;
  CompilerHLSL *this_local;
  
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir.declared_capabilities;
  __end1 = VectorView<spv::Capability>::begin(&this_00->super_VectorView<spv::Capability>);
  pCVar2 = VectorView<spv::Capability>::end(&this_00->super_VectorView<spv::Capability>);
  for (; __end1 != pCVar2; __end1 = __end1 + 1) {
    CVar1 = *__end1;
    if (CVar1 - CapabilityVariablePointersStorageBuffer < 2) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar3,"VariablePointers capability is not supported in HLSL.");
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((CVar1 == CapabilityShaderNonUniform || CVar1 == CapabilityRuntimeDescriptorArray) &&
       ((this->hlsl_options).shader_model < 0x33)) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar3,
                 "Shader model 5.1 or higher is required to use bindless resources or NonUniformResourceIndex."
                );
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
  }
  if ((this->super_CompilerGLSL).super_Compiler.ir.addressing_model != AddressingModelLogical) {
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar3,"Only Logical addressing model can be used with HLSL.");
    __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  if ((((this->hlsl_options).enable_16bit_types & 1U) != 0) &&
     ((this->hlsl_options).shader_model < 0x3e)) {
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (pCVar3,"Need at least shader model 6.2 when enabling native 16-bit type support.");
    __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  return;
}

Assistant:

void CompilerHLSL::validate_shader_model()
{
	// Check for nonuniform qualifier.
	// Instead of looping over all decorations to find this, just look at capabilities.
	for (auto &cap : ir.declared_capabilities)
	{
		switch (cap)
		{
		case CapabilityShaderNonUniformEXT:
		case CapabilityRuntimeDescriptorArrayEXT:
			if (hlsl_options.shader_model < 51)
				SPIRV_CROSS_THROW(
				    "Shader model 5.1 or higher is required to use bindless resources or NonUniformResourceIndex.");
			break;

		case CapabilityVariablePointers:
		case CapabilityVariablePointersStorageBuffer:
			SPIRV_CROSS_THROW("VariablePointers capability is not supported in HLSL.");

		default:
			break;
		}
	}

	if (ir.addressing_model != AddressingModelLogical)
		SPIRV_CROSS_THROW("Only Logical addressing model can be used with HLSL.");

	if (hlsl_options.enable_16bit_types && hlsl_options.shader_model < 62)
		SPIRV_CROSS_THROW("Need at least shader model 6.2 when enabling native 16-bit type support.");
}